

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  time_t expires;
  char *pcVar5;
  CURLcode CVar6;
  char date [65];
  char host [257];
  char acStack_188 [80];
  char local_138 [264];
  
  (*Curl_cfree)(h->filename);
  pcVar3 = (*Curl_cstrdup)(file);
  h->filename = pcVar3;
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (pcVar3 != (char *)0x0) {
    __stream = fopen64(file,"r");
    CVar6 = CURLE_OK;
    if (__stream != (FILE *)0x0) {
      pcVar3 = (char *)(*Curl_cmalloc)(0xfff);
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(h->filename);
        h->filename = (char *)0x0;
        fclose(__stream);
        CVar6 = CURLE_OUT_OF_MEMORY;
      }
      else {
        pcVar4 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream);
        if (pcVar4 != (char *)0x0) {
          pcVar4 = pcVar3;
          do {
            while( true ) {
              cVar1 = *pcVar4;
              if (cVar1 != '\t') break;
LAB_00121b64:
              pcVar4 = pcVar4 + 1;
            }
            if (cVar1 != '#') {
              if (cVar1 == ' ') goto LAB_00121b64;
              iVar2 = __isoc99_sscanf(pcVar4,"%256s \"%64[^\"]\"",local_138,acStack_188);
              if (iVar2 == 2) {
                expires = Curl_getdate_capped(acStack_188);
                hsts_create(h,local_138 + (local_138[0] == '.'),local_138[0] == '.',expires);
              }
            }
            pcVar5 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream);
            pcVar4 = pcVar3;
          } while (pcVar5 != (char *)0x0);
        }
        (*Curl_cfree)(pcVar3);
        fclose(__stream);
        CVar6 = CURLE_OK;
      }
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}